

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O1

void __thiscall vigra::BmpDecoderImpl::read_8bit_data(BmpDecoderImpl *this)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint i;
  _Ios_Seekdir _Var6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  
  uVar1 = (this->grayscale ^ 1) * 2 + 1;
  uVar9 = (this->info_header).width * uVar1;
  uVar7 = (ulong)((this->info_header).height * uVar9);
  std::istream::seekg((long)this,(this->file_header).offset);
  void_vector_base::reserve(&(this->pixels).super_void_vector_base,uVar7);
  (this->pixels).super_void_vector_base.m_size = (this->pixels).super_void_vector_base.m_capacity;
  iVar8 = (this->info_header).height;
  iVar4 = (this->info_header).width % 4;
  _Var6 = 4 - iVar4;
  if (iVar4 == 0) {
    _Var6 = _S_beg;
  }
  if (0 < iVar8) {
    lVar11 = uVar7 + (long)(this->pixels).super_void_vector_base.m_data;
    do {
      lVar11 = lVar11 - (ulong)uVar9;
      if (0 < (this->info_header).width) {
        iVar4 = 0;
        lVar10 = lVar11;
        do {
          iVar5 = std::istream::get();
          pvVar2 = (this->map).super_void_vector_base.m_data;
          uVar7 = 0;
          do {
            *(undefined1 *)(lVar10 + uVar7) =
                 *(undefined1 *)((long)pvVar2 + uVar7 + (long)iVar5 * 3);
            uVar7 = uVar7 + 1;
          } while (uVar1 != uVar7);
          lVar10 = lVar10 + (ulong)uVar1;
          iVar4 = iVar4 + 1;
        } while (iVar4 < (this->info_header).width);
      }
      std::istream::seekg((long)this,_Var6);
      bVar3 = 1 < iVar8;
      iVar8 = iVar8 + -1;
    } while (bVar3);
  }
  return;
}

Assistant:

void BmpDecoderImpl::read_8bit_data ()
{
    // these are sizes for the final image
    const unsigned int ncomp = grayscale ? 1 : 3;
    const unsigned int line_size = info_header.width * ncomp;
    const unsigned int image_size = info_header.height * line_size;

    // seek to the data
    stream.seekg( file_header.offset, std::ios::beg );

    // make room for the pixels
    pixels.resize(image_size);

    // padding after each line (must end on a 32-bit boundary)
    unsigned int pad_size = info_header.width % 4;
    if ( pad_size > 0 )
        pad_size = 4 - pad_size;

    // setup the base pointer at one line after the end
    UInt8 * base = pixels.data() + image_size;
    UInt8 * mover = base;

    // read scanlines from bottom to top
    for ( int y = info_header.height - 1; y >= 0; --y ) {

        // set the base pointer to the beginning of the line to be read
        base -= line_size;
        mover = base;

        // read the line from left to right
        for ( int x = 0; x < info_header.width; ++x ) {

            // get the color byte
            const int index = stream.get();

            // map and assign the pixel
            const UInt8 * map_base = map.data() + 3 * index;
            for ( unsigned int i = 0; i < ncomp; ++i )
                mover[i] = map_base[i];
            mover += ncomp;
        }

        // advance to the next 32 bit boundary
        stream.seekg( pad_size, std::ios::cur );
    }
}